

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O0

void __thiscall
rsg::VariableManager::VariableManager(VariableManager *this,NameAllocator *nameAllocator)

{
  NameAllocator *nameAllocator_local;
  VariableManager *this_local;
  
  std::vector<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>::vector
            (&this->m_variableScopeStack);
  std::vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>::vector
            (&this->m_valueScopeStack);
  std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::vector
            (&this->m_entryCache);
  this->m_numAllocatedScalars = 0;
  this->m_numAllocatedShaderInScalars = 0;
  this->m_numAllocatedShaderInVariables = 0;
  this->m_numAllocatedUniformScalars = 0;
  this->m_nameAllocator = nameAllocator;
  return;
}

Assistant:

VariableManager::VariableManager (NameAllocator& nameAllocator)
	: m_numAllocatedScalars				(0)
	, m_numAllocatedShaderInScalars		(0)
	, m_numAllocatedShaderInVariables	(0)
	, m_numAllocatedUniformScalars		(0)
	, m_nameAllocator					(nameAllocator)
{
}